

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
CHECK_BELLMAN_FORD(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *G,int *s,
                  WeightMap *weight,vector<unsigned_long,_std::allocator<unsigned_long>_> *pred,
                  vector<long,_std::allocator<long>_> *dist)

{
  unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *puVar1;
  int iVar2;
  pointer psVar3;
  pointer psVar4;
  unsigned_long uVar5;
  pointer plVar6;
  long lVar7;
  long *plVar8;
  long *plVar9;
  vector<long,_std::allocator<long>_> *pvVar10;
  EdgeProperties *p;
  integer_iterator<unsigned_long> iVar11;
  __normal_iterator<const_boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>
  _Var12;
  pointer piVar13;
  EdgeProperties *pEVar14;
  unsigned_long uVar15;
  _Head_base<0UL,_EdgeProperties_*,_false> _Var16;
  pointer puVar17;
  type *ptVar18;
  type tVar19;
  long lVar20;
  EdgeProperties *pEVar21;
  long lVar22;
  undefined8 uVar23;
  ulong uVar24;
  EdgeProperties *pEVar25;
  unsigned_long uVar26;
  AdjList *cg;
  size_type __n;
  EdgeIterator ei;
  EdgeIterator ei_end;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_1a8;
  WeightMap *local_110;
  _Head_base<0UL,_EdgeProperties_*,_false> local_108;
  undefined1 uStack_100;
  undefined7 uStack_ff;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  byte bStack_f0;
  long *local_e8;
  unsigned_long local_e0;
  long *local_d8;
  unsigned_long local_d0;
  long local_c8;
  vector<long,_std::allocator<long>_> *local_c0;
  unsigned_long local_b8;
  vector<bool,_std::allocator<bool>_> local_b0;
  undefined8 local_88;
  undefined1 uStack_80;
  undefined7 uStack_7f;
  undefined1 uStack_78;
  ulong uStack_77;
  long *local_68;
  _Head_base<0UL,_EdgeProperties_*,_false> *local_40;
  undefined8 *local_38;
  
  __n = (long)(G->super_type).m_vertices.
              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(G->super_type).m_vertices.
              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_1a8.first.vBegin.m_value._0_4_ = 4;
  local_110 = weight;
  local_c0 = dist;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict3 *)&local_1a8,
             (allocator_type *)&local_108);
  local_1a8.first.vBegin.m_value = local_1a8.first.vBegin.m_value & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_b0,__n,(bool *)&local_1a8,(allocator_type *)&local_108);
  dfs(G,s,&local_b0);
  psVar3 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar25 = (EdgeProperties *)((long)psVar4 - (long)psVar3 >> 5);
  puVar17 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar13 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (psVar4 != psVar3) {
    pEVar14 = (EdgeProperties *)0x0;
    do {
      if (pEVar14 != (EdgeProperties *)(long)*s) {
        pEVar21 = (EdgeProperties *)((long)&pEVar14[0xf].weight + 3);
        if (-1 < (long)pEVar14) {
          pEVar21 = pEVar14;
        }
        uVar24 = 1L << ((byte)pEVar14 & 0x3f) &
                 local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)pEVar21 >> 6) +
                  ((ulong)(((ulong)pEVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)];
        if ((pEVar14 == (EdgeProperties *)puVar17[(long)pEVar14]) == (uVar24 != 0)) {
          __assert_fail("(pred[*v] == *v) == (reachable[*v] == false)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0x8b,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
        if (uVar24 == 0) {
          piVar13[(long)pEVar14] = 1;
        }
      }
      pEVar14 = (EdgeProperties *)((long)&pEVar14->weight + 1);
    } while (pEVar25 != pEVar14);
    puVar17 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar13 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  uVar15 = (unsigned_long)*s;
  if (puVar17[uVar15] == uVar15) {
    piVar13[uVar15] = 0;
  }
  if (psVar4 != psVar3) {
    pEVar14 = (EdgeProperties *)0x0;
    do {
      if (piVar13[(long)pEVar14] == 4) {
        local_1a8.first.m_g =
             (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
              *)0x0;
        local_1a8.second.vBegin.m_value = 0;
        local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ = (type)0x0;
        local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ = (type)0x0;
        local_1a8.first.edges.super_type.m_storage.dummy_.aligner_ = (type)0x0;
        local_1a8.first.edges.super_type.m_storage.dummy_._8_8_ = (type)0x0;
        local_1a8.first.vEnd.m_value = 0;
        local_1a8.first.edges.super_type.m_initialized = false;
        local_1a8.first.edges.super_type._1_7_ = 0;
        local_1a8.first.vBegin.m_value = 0;
        local_1a8.first.vCurr.m_value = 0;
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                  ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8,0);
        _Var16._M_head_impl = pEVar14;
        while( true ) {
          piVar13 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          iVar2 = piVar13[(long)_Var16._M_head_impl];
          local_108._M_head_impl = _Var16._M_head_impl;
          if (iVar2 != 4) break;
          piVar13[(long)_Var16._M_head_impl] = 3;
          if ((property_ptr *)local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ ==
              &local_1a8.first.m_g[-1].m_property) {
            std::deque<unsigned_long,std::allocator<unsigned_long>>::
            _M_push_back_aux<unsigned_long_const&>
                      ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_1a8,
                       (unsigned_long *)&local_108);
          }
          else {
            *(EdgeProperties **)local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                 _Var16._M_head_impl;
            local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                 local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + 8;
          }
          _Var16._M_head_impl =
               (EdgeProperties *)
               (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)local_108._M_head_impl];
        }
        uVar23 = local_1a8.first.edges.super_type.m_storage.dummy_._24_8_;
        if (iVar2 == 3) {
          do {
            if (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ == uVar23) {
              pEVar21 = *(EdgeProperties **)(*(long *)(local_1a8.second.vBegin.m_value - 8) + 0x1f8)
              ;
              operator_delete((void *)uVar23,0x200);
              uVar23 = *(type *)(local_1a8.second.vBegin.m_value - 8);
              local_1a8.first.m_g =
                   (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                    *)(uVar23 + 0x200);
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ = uVar23 + 0x1f8;
              piVar13 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              _Var16._M_head_impl = local_108._M_head_impl;
              local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ = uVar23;
              local_1a8.second.vBegin.m_value = local_1a8.second.vBegin.m_value - 8;
            }
            else {
              pEVar21 = (((unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *)
                         (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8))->_M_t).
                        super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>
                        .super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl;
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                   local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8;
            }
            piVar13[(long)pEVar21] = 2;
          } while (pEVar21 != _Var16._M_head_impl);
          iVar11.m_value = local_1a8.first.vEnd.m_value;
          if (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ !=
              local_1a8.first.vEnd.m_value) {
            do {
              if (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ == uVar23) {
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start
                [*(long *)(*(long *)(local_1a8.second.vBegin.m_value - 8) + 0x1f8)] = -1;
                operator_delete((void *)uVar23,0x200);
                uVar23 = *(type *)(local_1a8.second.vBegin.m_value - 8);
                local_1a8.first.m_g =
                     (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                      *)(uVar23 + 0x200);
                local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ = uVar23 + 0x1f8;
                iVar11.m_value = local_1a8.first.vEnd.m_value;
                local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ = uVar23;
                local_1a8.second.vBegin.m_value = local_1a8.second.vBegin.m_value - 8;
              }
              else {
                puVar1 = (unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *)
                         (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8);
                local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                     local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8;
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start
                [(long)(puVar1->_M_t).
                       super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>
                       .super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl] = -1;
              }
            } while (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ != iVar11.m_value);
          }
        }
        else {
          iVar11.m_value = local_1a8.first.vEnd.m_value;
          if (iVar2 == 2) {
            iVar2 = -1;
          }
          while (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ != iVar11.m_value) {
            if (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ ==
                local_1a8.first.edges.super_type.m_storage.dummy_._24_8_) {
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [*(long *)(*(long *)(local_1a8.second.vBegin.m_value - 8) + 0x1f8)] = iVar2;
              operator_delete((void *)local_1a8.first.edges.super_type.m_storage.dummy_._24_8_,0x200
                             );
              local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ =
                   *(type *)(local_1a8.second.vBegin.m_value - 8);
              local_1a8.first.m_g =
                   (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                    *)(local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ + 0x200);
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                   local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ + 0x1f8;
              iVar11.m_value = local_1a8.first.vEnd.m_value;
              local_1a8.second.vBegin.m_value = local_1a8.second.vBegin.m_value - 8;
            }
            else {
              puVar1 = (unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *)
                       (local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8);
              local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ =
                   local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ + -8;
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(long)(puVar1->_M_t).
                     super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>.
                     super__Head_base<0UL,_EdgeProperties_*,_false>._M_head_impl] = iVar2;
            }
          }
        }
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                  ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8);
        piVar13 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pEVar14 = (EdgeProperties *)((long)&pEVar14->weight + 1);
    } while (pEVar14 != pEVar25);
    lVar20 = (long)(G->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(G->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar20 != 0) {
      uVar15 = lVar20 >> 5;
      uVar26 = 0;
      local_b8 = uVar15;
      do {
        if (piVar13[uVar26] == 2) {
          puVar17 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          lVar20 = 0;
          uVar15 = uVar26;
          do {
            uVar5 = puVar17[uVar15];
            psVar3 = (G->super_type).m_vertices.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1a8.first.vBegin.m_value = uVar15;
            local_1a8.first.vCurr.m_value = (value_type)operator_new(4);
            *(undefined4 *)local_1a8.first.vCurr.m_value = 0;
            _Var12 = std::
                     __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>const>>
                               (*(undefined8 *)
                                 &psVar3[uVar5].super_StoredVertex.m_out_edges.
                                  super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                                ,*(pointer *)
                                  ((long)&psVar3[uVar5].super_StoredVertex.m_out_edges.
                                          super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                                  + 8),&local_1a8);
            if ((undefined4 *)local_1a8.first.vCurr.m_value != (undefined4 *)0x0) {
              operator_delete((void *)local_1a8.first.vCurr.m_value,4);
            }
            lVar20 = lVar20 + *(int *)((long)&(((_Var12._M_current)->m_property)._M_t.
                                               super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_EdgeProperties_*,_std::default_delete<EdgeProperties>_>
                                               .super__Head_base<0UL,_EdgeProperties_*,_false>.
                                              _M_head_impl)->weight + local_110->tag);
            piVar13 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            piVar13[uVar15] = -2;
            puVar17 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            uVar15 = puVar17[uVar15];
          } while (uVar15 != uVar26);
          uVar15 = local_b8;
          if (-1 < lVar20) {
            __assert_fail("cycle_length < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                          ,0xbc,
                          "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                         );
          }
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar15);
    }
  }
  pvVar10 = local_c0;
  if ((piVar13[*s] == 0) &&
     ((local_c0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start[*s] != 0)) {
    __assert_fail("dist[s] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                  ,0xc0,
                  "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                 );
  }
  uStack_f8 = 0;
  uStack_f7 = 0;
  bStack_f0 = 0;
  local_108._M_head_impl = (EdgeProperties *)0x0;
  uStack_100 = 0;
  uStack_ff = 0;
  uStack_78 = 0;
  uStack_77 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uStack_7f = 0;
  psVar3 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8.first.vEnd.m_value = (long)psVar4 - (long)psVar3 >> 5;
  if (psVar4 == psVar3) {
    tVar19 = (type)0x0;
  }
  else {
    ptVar18 = (type *)&(psVar3->super_StoredVertex).m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8.first.vCurr.m_value = 0;
    do {
      if (*ptVar18 != (type)((_Vector_impl_data *)(ptVar18 + -1))->_M_start) {
        local_1a8.first.edges.super_type.m_initialized = true;
        local_1a8.first.edges.super_type.m_storage.dummy_.aligner_ =
             (type)((_Vector_impl_data *)(ptVar18 + -1))->_M_start;
        local_1a8.first.edges.super_type.m_storage.dummy_._8_8_ = local_1a8.first.vCurr.m_value;
        local_1a8.first.edges.super_type.m_storage.dummy_._16_8_ = *ptVar18;
        local_1a8.first.edges.super_type.m_storage.dummy_._24_8_ = local_1a8.first.vCurr.m_value;
        goto LAB_00112c31;
      }
      local_1a8.first.vCurr.m_value = local_1a8.first.vCurr.m_value + 1;
      ptVar18 = ptVar18 + 4;
      tVar19 = (type)local_1a8.first.vEnd.m_value;
    } while (local_1a8.first.vEnd.m_value != local_1a8.first.vCurr.m_value);
  }
  local_1a8.first.edges.super_type._0_8_ = (ulong)(uint7)local_1a8.first.edges.super_type._1_7_ << 8
  ;
  local_1a8.first.vCurr.m_value = (value_type)tVar19;
LAB_00112c31:
  local_1a8.first.vBegin.m_value = 0;
  local_40 = &local_108;
  local_1a8.second.vBegin.m_value = 0;
  local_1a8.second.edges.super_type.m_initialized = false;
  local_38 = &local_88;
  local_1a8.first.m_g = G;
  local_1a8.second.vCurr.m_value = local_1a8.first.vEnd.m_value;
  local_1a8.second.vEnd.m_value = local_1a8.first.vEnd.m_value;
  local_1a8.second.m_g = G;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_40,&local_1a8);
  uVar15 = CONCAT71(uStack_f7,uStack_f8);
  piVar13 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  plVar6 = (pvVar10->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar26 = CONCAT71(uStack_ff,uStack_100);
LAB_00112cf3:
  do {
    if (uVar26 == CONCAT71(uStack_7f,uStack_80)) {
      if (CONCAT71(uStack_7f,uStack_80) == uVar15) {
LAB_00112def:
        if (local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        return __return_storage_ptr__;
      }
      if (((bStack_f0 & 1) == 0) || ((uStack_77 & 0x100000000000000) == 0)) goto LAB_00112e23;
      if (local_e8 == local_68) goto LAB_00112def;
    }
    else if ((bStack_f0 & 1) == 0) {
LAB_00112e23:
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                    "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    lVar20 = *local_e8;
    if (piVar13[lVar20] == 0) {
      iVar2 = piVar13[local_e0];
      if (iVar2 == 0) {
        lVar22 = (long)*(int *)(local_e8[1] + local_110->tag) + plVar6[local_e0];
        lVar7 = plVar6[lVar20];
        if (lVar22 < lVar7) {
          __assert_fail("dist[v] + weight[*ei] >= dist[w]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0xca,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
        if ((lVar22 != lVar7) &&
           (local_e0 ==
            (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar20])) {
          __assert_fail("dist[v] + weight[*ei] == dist[w]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0xce,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
      }
      else if (iVar2 != 1) {
        __assert_fail("label[v] == FINITE || label[v] == PLUS",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                      ,199,
                      "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                     );
      }
    }
    local_e8 = local_e8 + 2;
    if (local_e8 == local_d8) {
      lVar20 = uVar26 * 0x20 + 0x28;
      do {
        if (uVar15 - 1 == uVar26) {
          uStack_100 = uStack_f8;
          uStack_ff = uStack_f7;
          uVar26 = uVar15;
          goto LAB_00112cf3;
        }
        plVar8 = *(long **)(*(long *)(local_c8 + 0x18) + -8 + lVar20);
        plVar9 = *(long **)(*(long *)(local_c8 + 0x18) + lVar20);
        lVar20 = lVar20 + 0x20;
        uVar26 = uVar26 + 1;
      } while (plVar9 == plVar8);
      uStack_100 = (undefined1)uVar26;
      uStack_ff = (undefined7)(uVar26 >> 8);
      local_e8 = plVar8;
      local_d0 = uVar26;
      local_d8 = plVar9;
      local_e0 = uVar26;
    }
  } while( true );
}

Assistant:

std::vector<int> CHECK_BELLMAN_FORD(const Graph& G, const int& s, const WeightMap& weight, std::vector<unsigned long>& pred, std::vector<long>& dist)
{
    // init
    unsigned long  n_vertices = num_vertices(G);
    enum{ NEG_CYCLE = -2, ATT_TO_CYCLE = -1, FINITE = 0, PLUS = 1, CYCLE = 2, ON_CUR_PATH = 3, UNKNOWN = 4 };
    std::vector<int> label(n_vertices, UNKNOWN);
    std::vector<bool> reachable(n_vertices, false);

    dfs(G,s,reachable);
    VertexIterator v, v_end;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        if (*v != s) {
            // if v in V+, their is a path s-v
            assert( (pred[*v] == *v) == (reachable[*v] == false));
            if (reachable[*v] == false) label[*v]=PLUS;
        }
    }

    // classification of nodes
    if (pred[s]==s) label[s]=FINITE;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        if(label[*v]==UNKNOWN) {
            std::stack<Vertex> S;
            Vertex w = *v;
            while (label[w]==UNKNOWN) {
                label[w]=ON_CUR_PATH;
                S.push(w);
                w = pred[w];
            }
            // label all nodes on current path
            int t = label[w];
            if ( t == ON_CUR_PATH ) {
                Vertex z;
                do { 
                    z = S.top(); S.pop();
                    label[z] = CYCLE;
                } while ( z != w );

                while ( !S.empty() ) {
                    label[S.top()] = ATT_TO_CYCLE;
                    S.pop();
                }
            } else { // t is CYCLE, ATT_TO_CYCLE, or FINITE
                if ( t == CYCLE ) t = ATT_TO_CYCLE;
                while ( !S.empty() ) {
                    label[S.top()] = t;
                    S.pop();
                }
            }
        }
    }

    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
         if ( label[*v] == CYCLE ){
            Vertex w = *v;
            long cycle_length = 0;
            do { 
                cycle_length += weight[edge(pred[w], w, G).first];
                label[w] = NEG_CYCLE;
                w = pred[w];
            } while (w != *v);
            // All cycles in P have negative weight
            assert(cycle_length < 0);
         }
    }

    if ( label[s] == FINITE ) assert(dist[s] == 0);
    EdgeIterator ei, ei_end;
    for (tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei){
        Vertex v = source(*ei, G);
        Vertex w = target(*ei, G);
        if ( label[w] == FINITE ) {
            // Their is no edge(v,w) where v in V- and w in Vf
            assert( label[v] == FINITE || label[v] == PLUS);
            // For each e(v,w) if v and w in Vf, dist[v] + weight[e] >= dist[w]
            if ( label[v] == FINITE ) {
                assert( dist[v] + weight[*ei] >= dist[w] );
                // For each vertex v in Vf,
                // If v=s then dist[v]=0
                // Else dist[v] = dist[u] + weight[edge(u,v)]
                if ( source(*ei, G) == pred[w] ) assert( dist[v] + weight[*ei] == dist[w] );
            }
        }
    }

    return label;
}